

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSpinBarrier.cpp
# Opt level: O0

WaitMode __thiscall de::anon_unknown_0::TestThread::getWaitMode(TestThread *this,Random *rnd)

{
  WaitMode WVar1;
  int numModes;
  Random *rnd_local;
  TestThread *this_local;
  
  WVar1 = Random::choose<de::SpinBarrier::WaitMode,de::SpinBarrier::WaitMode_const*>
                    (rnd,getWaitMode::s_allModes,
                     getWaitMode::s_allModes + (int)(3 - (uint)((this->m_busyOk & 1U) == 0)));
  return WVar1;
}

Assistant:

SpinBarrier::WaitMode getWaitMode (de::Random& rnd)
	{
		static const SpinBarrier::WaitMode	s_allModes[]	=
		{
			SpinBarrier::WAIT_MODE_YIELD,
			SpinBarrier::WAIT_MODE_AUTO,
			SpinBarrier::WAIT_MODE_BUSY,
		};
		const int							numModes		= DE_LENGTH_OF_ARRAY(s_allModes) - (m_busyOk ? 0 : 1);

		return rnd.choose<SpinBarrier::WaitMode>(DE_ARRAY_BEGIN(s_allModes), DE_ARRAY_BEGIN(s_allModes) + numModes);
	}